

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O0

void checkroots(double *phi,int *p,double *theta,int *q,double *PHI,int *P,double *THETA,int *Q)

{
  int iVar1;
  int ret;
  int *P_local;
  double *PHI_local;
  int *q_local;
  double *theta_local;
  int *p_local;
  double *phi_local;
  
  if ((0 < *p) && (iVar1 = archeck(*p,phi), iVar1 == 0)) {
    printf("\nnon-stationary AR part\n");
    exit(-1);
  }
  if (0 < *q) {
    invertroot(*q,theta);
  }
  if (((*P == *P) && (0 < *P)) && (iVar1 = archeck(*P,PHI), iVar1 == 0)) {
    printf("\nnon-stationary seasonal AR part\n");
    exit(-1);
  }
  if ((*Q == *Q) && (0 < *Q)) {
    invertroot(*Q,THETA);
  }
  return;
}

Assistant:

void checkroots(double *phi, int *p, double *theta, int *q, double *PHI, int *P, double *THETA, int *Q) {
	int ret;

	if (*p > 0) {
		ret = archeck(*p,phi);
		if (!ret) {
			printf("\nnon-stationary AR part\n");
			exit(-1);
		}
	}

	if (*q > 0) {
		invertroot(*q,theta);
	}

	if (*P == *P) {
		if (*P > 0) {
			ret = archeck(*P,PHI);
			if (!ret) {
				printf("\nnon-stationary seasonal AR part\n");
				exit(-1);
			}
		}
	}

	if (*Q == *Q) {
		if (*Q > 0) {
			invertroot(*Q,THETA);
		}
	}

}